

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

Node * __thiscall
TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::GetNode
          (TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>
           *this,FState *key)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & (uint)key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
LAB_0051b9b4:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,key);
        (pNVar2->Pair).Value.FileName.Chars = (char *)0x727dbc;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        (pNVar2->Pair).Value.ScriptLine = 0;
      }
      return pNVar2;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_0051b9b4;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}